

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::LayoutTests::__MultiLineUnboundLayoutProducesGlyphRunsForEachLine_meta(char **name)

{
  char **name_local;
  
  *name = "MultiLineUnboundLayoutProducesGlyphRunsForEachLine";
  return (offset_in_this_suite_class_to_subr)MultiLineUnboundLayoutProducesGlyphRunsForEachLine;
}

Assistant:

test( MultiLineUnboundLayoutProducesGlyphRunsForEachLine )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;

				l1.process(R("ABC CBA AB\nABB BBC\n"), limit::none(), *f1);
				l2.process(R("AC CB\nA AB\nABB BBC"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference11[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference12[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, 
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 120.2f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference11))
					+ ref_text_line(0.0f, 24.0f, 87.1f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference12)),
					mkvector(l1.begin(), l1.end()));


				positioned_glyph reference21[] = {
					{ 1, { 11.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference22[] = {
					{ 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference23[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } },
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 14.0f, 65.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference21))
					+ ref_text_line(0.0f, 32.0f, 42.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference22))
					+ ref_text_line(0.0f, 50.0f, 87.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference23)),
					mkvector(l2.begin(), l2.end()));
			}